

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O3

int module_unload(Server *server)

{
  _Rb_tree_node_base *p_Var1;
  long *plVar2;
  size_t __n;
  long *__dest;
  
  puts("Unloading module FileServer...");
  for (p_Var1 = filename_to_buffer_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &filename_to_buffer_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ; p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[3]._M_parent != (_Base_ptr)0x0) {
      operator_delete__(p_Var1[3]._M_parent);
    }
  }
  __dest = *(long **)server;
  plVar2 = *(long **)(server + 8);
  if (__dest != plVar2) {
    __n = (long)plVar2 - (long)__dest;
    do {
      __n = __n - 8;
      if ((code *)*__dest == http_request_handler) {
        if (__dest + 1 != plVar2) {
          memmove(__dest,__dest + 1,__n);
          plVar2 = *(long **)(server + 8);
        }
        *(long **)(server + 8) = plVar2 + -1;
        break;
      }
      __dest = __dest + 1;
    } while (__dest != plVar2);
  }
  puts("Unloaded module FileServer");
  return 0;
}

Assistant:

int module_unload(Server *server) {
    printf("Unloading module FileServer...\n");
    unload_file_from_mem();
    Server::remove_from_hook(server->http_request_hook, &http_request_handler);
    printf("Unloaded module FileServer\n");
    return 0;
}